

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

int SUNLogger_GetOutputRank(SUNLogger logger,int *output_rank)

{
  int retval;
  int *output_rank_local;
  SUNLogger logger_local;
  
  if (logger == (SUNLogger)0x0) {
    retval = -1;
  }
  else {
    *output_rank = logger->output_rank;
    retval = 0;
  }
  return retval;
}

Assistant:

int SUNLogger_GetOutputRank(SUNLogger logger, int* output_rank)
{
  int retval = 0;
  if (logger == NULL)
  {
    retval = -1;
  }
  else
  {
    *output_rank = logger->output_rank;
    retval       = 0;
  }
  return retval;
}